

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

int __thiscall
jwt::algorithm::rsa::verify
          (rsa *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int iVar1;
  EVP_MD_CTX *ctx_00;
  EVP_MD *type;
  runtime_error *prVar2;
  long *plVar3;
  ulong e;
  long *plVar4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx_00 == (EVP_MD_CTX *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed to verify signature: could not create context")
    ;
  }
  else {
    type = (EVP_MD *)(*this->md)();
    iVar1 = EVP_DigestInit(ctx_00,type);
    if (iVar1 == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"failed to verify signature: VerifyInit failed");
    }
    else {
      iVar1 = EVP_DigestUpdate(ctx_00,*(void **)ctx,*(size_t *)(ctx + 8));
      if (iVar1 != 0) {
        iVar1 = EVP_VerifyFinal(ctx_00,*(uchar **)sig,*(uint *)(sig + 8),
                                (EVP_PKEY *)
                                (this->pkey).
                                super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (iVar1 == 1) {
          iVar1 = EVP_MD_CTX_free(ctx_00);
          return iVar1;
        }
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_70,iVar1);
        std::operator+(&local_50,"evp verify final failed: ",&local_70);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_b0 == plVar4) {
          local_a0 = *plVar4;
          lStack_98 = plVar3[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar4;
        }
        local_a8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        e = ERR_get_error();
        ERR_error_string(e,(char *)0x0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_90 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_90 == plVar4) {
          local_80 = *plVar4;
          lStack_78 = plVar3[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar4;
        }
        local_88 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::runtime_error::runtime_error(prVar2,(string *)&local_90);
        *(undefined ***)prVar2 = &PTR__runtime_error_00113cb8;
        __cxa_throw(prVar2,&signature_verification_exception::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"failed to verify signature: VerifyUpdate failed");
    }
  }
  *(undefined ***)prVar2 = &PTR__runtime_error_00113cb8;
  __cxa_throw(prVar2,&signature_verification_exception::typeinfo,std::runtime_error::~runtime_error)
  ;
}

Assistant:

void verify(const std::string& data, const std::string& signature) const {
#ifdef OPENSSL10
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_destroy)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_destroy);
#else
				std::unique_ptr<EVP_MD_CTX, decltype(&EVP_MD_CTX_free)> ctx(EVP_MD_CTX_create(), EVP_MD_CTX_free);
#endif
				if (!ctx)
					throw signature_verification_exception("failed to verify signature: could not create context");
				if (!EVP_VerifyInit(ctx.get(), md()))
					throw signature_verification_exception("failed to verify signature: VerifyInit failed");
				if (!EVP_VerifyUpdate(ctx.get(), data.data(), data.size()))
					throw signature_verification_exception("failed to verify signature: VerifyUpdate failed");
				auto res = EVP_VerifyFinal(ctx.get(), (const unsigned char*)signature.data(), static_cast<unsigned int>(signature.size()), pkey.get());
				if (res != 1)
					throw signature_verification_exception("evp verify final failed: " + std::to_string(res) + " " + ERR_error_string(ERR_get_error(), NULL));
			}